

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O0

void Abc_NtkCollectNonOverlapCands
               (Abc_Obj_t *pLut,Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,Vec_Ptr_t *vCands,
               Nwk_LMPars_t *pPars)

{
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  void *Entry;
  Abc_Obj_t *p_00;
  int local_48;
  int local_44;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vTemp;
  Nwk_LMPars_t *pPars_local;
  Vec_Ptr_t *vCands_local;
  Vec_Ptr_t *vNext_local;
  Vec_Ptr_t *vStart_local;
  Abc_Obj_t *pLut_local;
  
  Vec_PtrClear(vCands);
  iVar3 = pPars->nMaxSuppSize;
  iVar2 = Abc_ObjFaninNum(pLut);
  if (1 < iVar3 - iVar2) {
    if (pPars->nMaxDistance < 1) {
      __assert_fail("pPars->nMaxDistance > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMerge.c"
                    ,0x98,
                    "void Abc_NtkCollectNonOverlapCands(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Nwk_LMPars_t *)"
                   );
    }
    Vec_PtrClear(vStart);
    Vec_PtrPush(vStart,pLut);
    Abc_NtkIncrementTravId(pLut->pNtk);
    Abc_NodeSetTravIdCurrent(pLut);
    vCands_local = vNext;
    vNext_local = vStart;
    for (local_44 = 1; pVVar1 = vNext_local, p = vCands_local, local_44 <= pPars->nMaxDistance;
        local_44 = local_44 + 1) {
      Abc_NtkCollectCircle(vNext_local,vCands_local,pPars->nMaxFanout);
      vNext_local = vCands_local;
      vCands_local = pVVar1;
      for (local_48 = 0; iVar3 = Vec_PtrSize(p), local_48 < iVar3; local_48 = local_48 + 1) {
        Entry = Vec_PtrEntry(p,local_48);
        Vec_PtrPush(vCands,Entry);
      }
    }
    Abc_NtkIncrementTravId(pLut->pNtk);
    if (pPars->fUseTfiTfo == 0) {
      Abc_NodeSetTravIdPrevious(pLut);
      iVar3 = Abc_ObjLevel(pLut);
      Abc_NtkMarkFanins_rec(pLut,iVar3 - pPars->nMaxDistance);
      Abc_NodeSetTravIdPrevious(pLut);
      iVar3 = Abc_ObjLevel(pLut);
      Abc_NtkMarkFanouts_rec(pLut,iVar3 + pPars->nMaxDistance,pPars->nMaxFanout);
    }
    else {
      Abc_NodeSetTravIdCurrent(pLut);
    }
    local_48 = 0;
    for (local_44 = 0; iVar3 = Vec_PtrSize(vCands), local_44 < iVar3; local_44 = local_44 + 1) {
      p_00 = (Abc_Obj_t *)Vec_PtrEntry(vCands,local_44);
      iVar3 = Abc_NodeIsTravIdCurrent(p_00);
      if (iVar3 == 0) {
        iVar3 = Abc_ObjFaninNum(pLut);
        iVar2 = Abc_ObjFaninNum(p_00);
        if (iVar3 + iVar2 <= pPars->nMaxSuppSize) {
          iVar3 = Abc_ObjLevel(pLut);
          iVar2 = Abc_ObjLevel(p_00);
          if (iVar3 - iVar2 <= pPars->nMaxLevelDiff) {
            iVar3 = Abc_ObjLevel(p_00);
            iVar2 = Abc_ObjLevel(pLut);
            if (iVar3 - iVar2 <= pPars->nMaxLevelDiff) {
              Vec_PtrWriteEntry(vCands,local_48,p_00);
              local_48 = local_48 + 1;
            }
          }
        }
      }
    }
    Vec_PtrShrink(vCands,local_48);
  }
  return;
}

Assistant:

void Abc_NtkCollectNonOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Vec_Ptr_t * vTemp;
    Abc_Obj_t * pObj;
    int i, k;
    Vec_PtrClear( vCands );
    if ( pPars->nMaxSuppSize - Abc_ObjFaninNum(pLut) <= 1 )
        return;

    // collect nodes removed by this distance
    assert( pPars->nMaxDistance > 0 );
    Vec_PtrClear( vStart );
    Vec_PtrPush( vStart, pLut );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    for ( i = 1; i <= pPars->nMaxDistance; i++ )
    {
        Abc_NtkCollectCircle( vStart, vNext, pPars->nMaxFanout );
        vTemp  = vStart;
        vStart = vNext;
        vNext  = vTemp;
        // collect the nodes in vStart
        Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, k )
            Vec_PtrPush( vCands, pObj );
    }

    // mark the TFI/TFO nodes
    Abc_NtkIncrementTravId( pLut->pNtk );
    if ( pPars->fUseTfiTfo )
        Abc_NodeSetTravIdCurrent( pLut );
    else
    {
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanins_rec( pLut, Abc_ObjLevel(pLut) - pPars->nMaxDistance );
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanouts_rec( pLut, Abc_ObjLevel(pLut) + pPars->nMaxDistance, pPars->nMaxFanout );
    }

    // collect nodes satisfying the following conditions:
    // - they are close enough in terms of distance
    // - they are not in the TFI/TFO of the LUT
    // - they have no more than the given number of fanins
    // - they have no more than the given diff in delay
    k = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCands, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pLut) + Abc_ObjFaninNum(pObj) > pPars->nMaxSuppSize )
            continue;
        if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
             Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
             continue;
        Vec_PtrWriteEntry( vCands, k++, pObj );
    }
    Vec_PtrShrink( vCands, k );
}